

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialModule.cpp
# Opt level: O1

tensor __thiscall module::SequentialModule::predict(SequentialModule *this,tensor in)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  pointer ppLVar4;
  tensor ppplVar5;
  pointer ppLVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar1 = this->_sizeXIn;
  if (0 < (long)iVar1) {
    uVar2 = this->_sizeYIn;
    uVar3 = this->_sizeZIn;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        ppplVar5 = this->_in;
        uVar8 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar9 = 0;
            do {
              ppplVar5[uVar9][uVar8][lVar7] = in[uVar9][uVar8][lVar7];
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar2);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  ppLVar4 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar6 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar6 != ppLVar4) {
    uVar8 = 0;
    do {
      (*ppLVar4[uVar8]->_vptr_Layer[3])();
      uVar8 = uVar8 + 1;
      ppLVar4 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppLVar6 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar8 < (ulong)((long)ppLVar6 - (long)ppLVar4 >> 3));
  }
  ppplVar5 = layer::Layer::getPtrOut(ppLVar6[-1]);
  return ppplVar5;
}

Assistant:

type::tensor SequentialModule::predict(type::tensor in)
    {
        for(int x(0); x < _sizeXIn; x++)
            for(int y(0); y < _sizeYIn; y++)
                for(int z(0); z < _sizeZIn; z++)
                    _in[z][y][x] = in[z][y][x];

        for(int itLayer(0); itLayer < _lLayers.size(); itLayer++)
            _lLayers[itLayer]->predict();
        return _lLayers.back()->getPtrOut();
    }